

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O0

void * __thiscall
xercesc_4_0::DOMDocumentImpl::getUserData(DOMDocumentImpl *this,DOMNodeImpl *n,XMLCh *key)

{
  uint key2;
  KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *this_00;
  DOMUserDataRecord *dataRecord;
  uint keyId;
  XMLCh *key_local;
  DOMNodeImpl *n_local;
  DOMDocumentImpl *this_local;
  
  if (((this->fUserDataTable ==
        (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
         *)0x0) || (key2 = XMLStringPool::getId(&this->fUserDataTableKeys,key), key2 == 0)) ||
     (this_00 = RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                ::get(this->fUserDataTable,n,key2),
     this_00 == (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)0x0)) {
    this_local = (DOMDocumentImpl *)0x0;
  }
  else {
    this_local = (DOMDocumentImpl *)
                 KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>::getKey(this_00);
  }
  return this_local;
}

Assistant:

void* DOMDocumentImpl::getUserData(const DOMNodeImpl* n, const XMLCh* key) const
{
    if (fUserDataTable) {
        unsigned int keyId=fUserDataTableKeys.getId(key);
        if(keyId!=0) {
            DOMUserDataRecord* dataRecord = fUserDataTable->get((void*)n, keyId);
            if (dataRecord)
                return dataRecord->getKey();
        }
    }

    return 0;
}